

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_jmp_32_al(void)

{
  uint addr_in;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 4;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68ki_cpu.pc = m68k_read_memory_32(addr_in & m68ki_cpu.address_mask);
  if (m68ki_cpu.pc == m68ki_cpu.ppc) {
    m68ki_remaining_cycles =
         m68ki_remaining_cycles % (int)(uint)m68ki_cpu.cyc_instruction[m68ki_cpu.ir];
  }
  return;
}

Assistant:

static void m68k_op_jmp_32_al(void)
{
	m68ki_jump(EA_AL_32());
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	if(REG_PC == REG_PPC)
		USE_ALL_CYCLES();
}